

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *args)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *pSVar4;
  
  pSVar4 = (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)this->endPtr < pSVar4 + 1) {
    pSVar4 = (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
             allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pSVar4 + 1);
  }
  SVar2 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(pSVar4->super_SyntaxListBase).super_SyntaxNode.field_0xc = uVar3;
  (pSVar4->super_SyntaxListBase).childCount = (args->super_SyntaxListBase).childCount;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b850;
  sVar1 = (args->elements).size_;
  (pSVar4->elements).data_ = (args->elements).data_;
  (pSVar4->elements).size_ = sVar1;
  return pSVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }